

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O3

ostream * FIX::operator<<(ostream *stream,SessionSettings *sessionSettings)

{
  char cVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  Dictionary *pDVar7;
  _Base_ptr p_Var8;
  string local_80;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  cVar1 = (char)stream;
  if ((sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[DEFAULT]",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    for (p_Var6 = (sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,sessionSettings);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"[SESSION]",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pDVar7 = SessionSettings::get(sessionSettings,(SessionID *)(p_Var8 + 1));
      if ((pDVar7->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var6 = (pDVar7->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(pDVar7->m_data)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          bVar3 = Dictionary::has(&sessionSettings->m_defaults,(string *)(p_Var6 + 1));
          if (bVar3) {
            Dictionary::getString
                      (&local_80,&sessionSettings->m_defaults,(string *)(p_Var6 + 1),false);
            _Var2._M_p = local_80._M_dataplus._M_p;
            if ((_Base_ptr)local_80._M_string_length == p_Var6[2]._M_parent) {
              if ((_Base_ptr)local_80._M_string_length == (_Base_ptr)0x0) {
                bVar3 = true;
              }
              else {
                iVar4 = bcmp(local_80._M_dataplus._M_p,*(void **)(p_Var6 + 2),
                             local_80._M_string_length);
                bVar3 = iVar4 == 0;
              }
            }
            else {
              bVar3 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var2._M_p != &local_80.field_2) {
              operator_delete(_Var2._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if (!bVar3) goto LAB_001b4eff;
          }
          else {
LAB_001b4eff:
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (stream,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_60);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const SessionSettings &sessionSettings) {
  const Dictionary &defaults = sessionSettings.get();
  if (defaults.size()) {
    stream << "[DEFAULT]" << std::endl;
    for (const Dictionary::value_type &defaultParam : defaults) {
      stream << defaultParam.first << "=" << defaultParam.second << std::endl;
    }
    stream << std::endl;
  }

  for (const SessionID &sessionID : sessionSettings.getSessions()) {
    stream << "[SESSION]" << std::endl;
    const Dictionary &section = sessionSettings.get(sessionID);
    if (!section.size()) {
      continue;
    }

    for (const Dictionary::value_type &sectionParam : section) {
      if (defaults.has(sectionParam.first) && defaults.getString(sectionParam.first) == sectionParam.second) {
        continue;
      }
      stream << sectionParam.first << "=" << sectionParam.second << std::endl;
    }
    stream << std::endl;
  }

  return stream;
}